

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O2

void CompilationContext::globalError(char *error)

{
  value_type local_68;
  
  if (errorLevel < 4) {
    errorLevel = 4;
  }
  if (redirectMessagesToJson == (char *)0x0) {
    fprintf((FILE *)out_stream,"ERROR: %s\n",error);
  }
  local_68.message._M_dataplus._M_p = (pointer)&local_68.message.field_2;
  local_68.message._M_string_length = 0;
  local_68.message.field_2._M_local_buf[0] = '\0';
  local_68.fileName._M_dataplus._M_p = (pointer)&local_68.fileName.field_2;
  local_68.fileName._M_string_length = 0;
  local_68.fileName.field_2._M_local_buf[0] = '\0';
  local_68.textId = "";
  local_68.line = 0;
  local_68.column = 0;
  local_68.intId = 0;
  local_68.isError = true;
  std::__cxx11::string::assign((char *)&local_68.message);
  std::__cxx11::string::assign((char *)&local_68.fileName);
  std::vector<CompilerMessage,_std::allocator<CompilerMessage>_>::push_back
            (&compilerMessages,&local_68);
  CompilerMessage::~CompilerMessage(&local_68);
  return;
}

Assistant:

void CompilationContext::globalError(const char * error)
{
  CompilationContext::setErrorLevel(ERRORLEVEL_FATAL);

  if (!redirectMessagesToJson)
    fprintf(out_stream, "ERROR: %s\n", error);

  CompilerMessage cm;
  cm.line = 0;
  cm.column = 0;
  cm.intId = 0;
  cm.isError = true;
  cm.message = error;
  cm.fileName = "";
  compilerMessages.push_back(cm);
}